

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_pre.hpp
# Opt level: O2

Dataset * __thiscall
notch::pre::SquareAugmented::apply
          (Dataset *__return_storage_ptr__,SquareAugmented *this,Dataset *dataIn)

{
  pointer pvVar1;
  pointer __v;
  Dataset dOut;
  Array a;
  vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> local_68;
  valarray<float> local_50;
  valarray<float> local_40;
  
  local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::reserve
            (&local_68,
             (long)(dataIn->
                   super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>)
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(dataIn->
                   super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>)
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  __v = (dataIn->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>).
        _M_impl.super__Vector_impl_data._M_start;
  pvVar1 = (dataIn->super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__v == pvVar1) {
    std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::vector
              ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)
               __return_storage_ptr__,
               (vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)dataIn);
  }
  else {
    for (; __v != pvVar1; __v = __v + 1) {
      core::std::valarray<float>::valarray(&local_40,__v);
      (*(this->super_ADatasetTransformer)._vptr_ADatasetTransformer[1])(&local_50,this,&local_40);
      std::vector<std::valarray<float>,std::allocator<std::valarray<float>>>::
      emplace_back<std::valarray<float>>
                ((vector<std::valarray<float>,std::allocator<std::valarray<float>>> *)&local_68,
                 &local_50);
      operator_delete(local_50._M_data);
      operator_delete(local_40._M_data);
    }
    (__return_storage_ptr__->
    super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>)._M_impl.
    super__Vector_impl_data._M_start =
         local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (__return_storage_ptr__->
    super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->
    super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.super__Vector_base<std::valarray<float>,_std::allocator<std::valarray<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  core::std::vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_>::~vector
            ((vector<std::valarray<float>,_std::allocator<std::valarray<float>_>_> *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

virtual Dataset apply(const Dataset &dataIn) {
        Dataset dOut;
        dOut.reserve(dataIn.size());
        if (dataIn.empty()) {
            return dataIn;
        }
        for (Array a : dataIn) {
            dOut.push_back(apply(a));
        }
        return dOut;
    }